

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  U32 *loadedDictEndPtr;
  ZSTD_matchState_t **dictMatchStatePtr;
  seqStore_t *origSeqStore;
  U32 *pUVar1;
  seqStore_t *resultSeqStore;
  seqStore_t *resultSeqStore_00;
  BYTE *iend;
  undefined8 uVar2;
  undefined8 uVar3;
  BYTE BVar4;
  uint uVar5;
  ZSTD_paramSwitch_e ZVar6;
  ZSTD_compressedBlockState_t *pZVar7;
  seqDef *psVar8;
  ushort uVar9;
  short sVar10;
  U32 UVar11;
  int iVar12;
  size_t err_code;
  size_t sVar13;
  ulong uVar14;
  ushort uVar15;
  uint uVar16;
  size_t sVar17;
  short *dst_00;
  size_t err_code_1;
  ulong uVar18;
  seqStore_t *psVar19;
  unsigned_long_long uVar20;
  seqStore_t *psVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  size_t sVar26;
  ulong uVar27;
  bool bVar28;
  byte bVar29;
  undefined1 auVar30 [16];
  BYTE *local_110;
  repcodes_t dRep;
  undefined4 uStack_e4;
  size_t local_90;
  short *local_88;
  long local_80;
  repcodes_t local_68;
  size_t local_58;
  ZSTD_CCtx_params *local_50;
  ulong local_48;
  ZSTD_cwksp *local_40;
  BYTE *local_38;
  
  bVar29 = 0;
  if (cctx->stage == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  if (cctx->stage == ZSTDcs_init && frame != 0) {
    local_58 = ZSTD_writeFrameHeader
                         (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                          cctx->dictID);
    if (0xffffffffffffff88 < local_58) {
      return local_58;
    }
    bVar28 = dstCapacity < local_58;
    dstCapacity = dstCapacity - local_58;
    if (bVar28) {
      __assert_fail("fhSize <= dstCapacity",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x62a6,
                    "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                   );
    }
    dst = (void *)((long)dst + local_58);
    cctx->stage = ZSTDcs_ongoing;
  }
  else {
    local_58 = 0;
  }
  if (srcSize == 0) {
    return local_58;
  }
  ms = &(cctx->blockState).matchState;
  UVar11 = ZSTD_window_update(&ms->window,src,srcSize,
                              (cctx->blockState).matchState.forceNonContiguous);
  if (UVar11 == 0) {
    (cctx->blockState).matchState.forceNonContiguous = 0;
    (cctx->blockState).matchState.nextToUpdate = (cctx->blockState).matchState.window.dictLimit;
  }
  if ((cctx->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
    ZSTD_window_update(&(cctx->ldmState).window,src,srcSize,0);
  }
  if (frame == 0) {
    ZSTD_overflowCorrectIfNeeded
              (ms,&cctx->workspace,&cctx->appliedParams,src,(void *)(srcSize + (long)src));
    uVar23 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
  }
  else {
    uVar5 = (cctx->appliedParams).cParams.windowLog;
    local_48 = (ulong)(uint)(1 << ((byte)uVar5 & 0x1f));
    if (0x1f < uVar5) {
      __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x61ec,
                    "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                   );
    }
    sVar17 = cctx->blockSize;
    if ((cctx->appliedParams).fParams.checksumFlag != 0) {
      XXH_INLINE_XXH64_update(&cctx->xxhState,src,srcSize);
    }
    local_40 = &cctx->workspace;
    loadedDictEndPtr = &(cctx->blockState).matchState.loadedDictEnd;
    dictMatchStatePtr = &(cctx->blockState).matchState.dictMatchState;
    origSeqStore = &cctx->seqStore;
    pUVar1 = (cctx->blockSplitCtx).partitions;
    resultSeqStore = &(cctx->blockSplitCtx).nextSeqStore;
    resultSeqStore_00 = &(cctx->blockSplitCtx).currSeqStore;
    dst_00 = (short *)dst;
    local_110 = (BYTE *)src;
    local_50 = &cctx->appliedParams;
    for (sVar26 = srcSize; sVar26 != 0; sVar26 = sVar26 - sVar17) {
      uVar5 = lastFrameChunk & 1;
      if (sVar17 < sVar26) {
        uVar5 = 0;
      }
      if (dstCapacity < 6) {
        return 0xffffffffffffffba;
      }
      if (sVar26 < sVar17) {
        sVar17 = sVar26;
      }
      iend = local_110 + sVar17;
      ZSTD_overflowCorrectIfNeeded(ms,local_40,local_50,local_110,iend);
      uVar16 = (int)iend - *(int *)&(cctx->blockState).matchState.window.base;
      uVar22 = (cctx->blockState).matchState.loadedDictEnd;
      local_38 = iend;
      if (uVar16 < uVar22) {
        __assert_fail("blockEndIdx >= loadedDictEnd",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x48a8,
                      "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                     );
      }
      if ((uVar22 + (U32)local_48 < uVar16) ||
         (uVar22 != (cctx->blockState).matchState.window.dictLimit)) {
        *loadedDictEndPtr = 0;
        *dictMatchStatePtr = (ZSTD_matchState_t *)0x0;
      }
      ZSTD_window_enforceMaxDist
                (&ms->window,local_110,(U32)local_48,loadedDictEndPtr,dictMatchStatePtr);
      uVar22 = (cctx->blockState).matchState.window.lowLimit;
      if ((cctx->blockState).matchState.nextToUpdate < uVar22) {
        (cctx->blockState).matchState.nextToUpdate = uVar22;
      }
      uVar9 = (ushort)uVar5;
      sVar10 = (short)sVar17;
      if ((cctx->appliedParams).targetCBlockSize == 0) {
        ZVar6 = (cctx->appliedParams).useBlockSplitter;
        if (ZVar6 == ZSTD_ps_enable) {
          sVar13 = ZSTD_buildSeqStore(cctx,local_110,sVar17);
          if (0xffffffffffffff88 < sVar13) {
            return sVar13;
          }
          if (sVar13 == 1) {
            pZVar7 = (cctx->blockState).prevCBlock;
            if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
              (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
            }
            if (dstCapacity < sVar17 + 3) {
              return 0xffffffffffffffba;
            }
            *dst_00 = uVar9 + sVar10 * 8;
            *(char *)(dst_00 + 1) = (char)(sVar17 >> 0xd);
            memcpy((void *)((long)dst_00 + 3),local_110,sVar17);
            uVar14 = sVar17 + 3;
          }
          else {
            uVar23 = (ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3;
            stack0xffffffffffffff18 = 0;
            uVar22 = (uint)uVar23;
            if (4 < uVar22) {
              dRep.rep._0_8_ = pUVar1;
              ZSTD_deriveBlockSplitsHelper
                        ((seqStoreSplits *)&dRep,0,uVar23 & 0xffffffff,cctx,origSeqStore);
              *(uint *)(dRep.rep._0_8_ + stack0xffffffffffffff18 * 4) = uVar22;
            }
            uVar23 = stack0xffffffffffffff18;
            pZVar7 = (cctx->blockState).prevCBlock;
            stack0xffffffffffffff18 = CONCAT44(uStack_e4,pZVar7->rep[2]);
            dRep.rep._0_8_ = *(undefined8 *)pZVar7->rep;
            local_68.rep._0_8_ = *(undefined8 *)pZVar7->rep;
            local_68.rep[2] = pZVar7->rep[2];
            (cctx->blockSplitCtx).nextSeqStore.maxNbLit = 0;
            (cctx->blockSplitCtx).nextSeqStore.longLengthType = ZSTD_llt_none;
            (cctx->blockSplitCtx).nextSeqStore.longLengthPos = 0;
            (cctx->blockSplitCtx).nextSeqStore.ofCode = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.maxNbSeq = 0;
            (cctx->blockSplitCtx).nextSeqStore.llCode = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.mlCode = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.litStart = (BYTE *)0x0;
            (cctx->blockSplitCtx).nextSeqStore.lit = (BYTE *)0x0;
            resultSeqStore->sequencesStart = (seqDef *)0x0;
            resultSeqStore->sequences = (seqDef *)0x0;
            if (uVar23 == 0) {
              uVar14 = ZSTD_compressSeqStore_singleBlock
                                 (cctx,origSeqStore,&dRep,&local_68,dst_00,dstCapacity,local_110,
                                  sVar17,uVar5,0);
              if (uVar14 < 0xffffffffffffff89) {
                if (0x20000 < cctx->blockSize) {
                  __assert_fail("zc->blockSize <= ZSTD_BLOCKSIZE_MAX",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x60ed,
                                "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                               );
                }
                if (cctx->blockSize + 3 < uVar14) {
                  __assert_fail("cSizeSingleBlock <= zc->blockSize + ZSTD_blockHeaderSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x60ee,
                                "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                               );
                }
              }
            }
            else {
              ZSTD_deriveSeqStoreChunk(resultSeqStore_00,origSeqStore,0,(ulong)*pUVar1);
              local_80 = 0;
              uVar18 = 0;
              local_90 = dstCapacity;
              local_88 = dst_00;
              for (uVar27 = 0; uVar27 <= uVar23; uVar27 = uVar27 + 1) {
                sVar13 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore_00);
                psVar8 = (cctx->blockSplitCtx).currSeqStore.sequencesStart;
                lVar25 = 0;
                for (uVar14 = 0;
                    (long)(cctx->blockSplitCtx).currSeqStore.sequences - (long)psVar8 >> 3 != uVar14
                    ; uVar14 = uVar14 + 1) {
                  lVar24 = lVar25 + (ulong)psVar8[uVar14].mlBase;
                  lVar25 = lVar24 + 3;
                  if ((uVar14 == (cctx->blockSplitCtx).currSeqStore.longLengthPos) &&
                     ((cctx->blockSplitCtx).currSeqStore.longLengthType == ZSTD_llt_matchLength)) {
                    lVar25 = lVar24 + 0x10003;
                  }
                }
                sVar13 = lVar25 + sVar13;
                local_80 = local_80 + sVar13;
                if (uVar27 == uVar23) {
                  sVar13 = (sVar13 + sVar17) - local_80;
                  uVar22 = uVar5;
                }
                else {
                  ZSTD_deriveSeqStoreChunk
                            (resultSeqStore,origSeqStore,(ulong)pUVar1[uVar27],
                             (ulong)(cctx->blockSplitCtx).partitions[uVar27 + 1]);
                  uVar22 = 0;
                }
                uVar14 = ZSTD_compressSeqStore_singleBlock
                                   (cctx,resultSeqStore_00,&dRep,&local_68,local_88,local_90,
                                    local_110,sVar13,uVar22,1);
                if (0xffffffffffffff88 < uVar14) goto LAB_0015f3e8;
                psVar19 = resultSeqStore;
                psVar21 = resultSeqStore_00;
                for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
                  psVar21->sequencesStart = psVar19->sequencesStart;
                  psVar19 = (seqStore_t *)((long)psVar19 + (ulong)bVar29 * -0x10 + 8);
                  psVar21 = (seqStore_t *)((long)psVar21 + (ulong)bVar29 * -0x10 + 8);
                }
                if (cctx->blockSize + 3 < uVar14) {
                  __assert_fail("cSizeChunk <= zc->blockSize + ZSTD_blockHeaderSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x6110,
                                "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                               );
                }
                uVar18 = uVar18 + uVar14;
                local_90 = local_90 - uVar14;
                local_88 = (short *)((long)local_88 + uVar14);
                local_110 = local_110 + sVar13;
              }
              pZVar7 = (cctx->blockState).prevCBlock;
              pZVar7->rep[2] = dRep.rep[2];
              *(undefined8 *)pZVar7->rep = dRep.rep._0_8_;
              uVar14 = uVar18;
            }
          }
LAB_0015f3e8:
          if (0xffffffffffffff88 < uVar14) {
            return uVar14;
          }
          if (uVar14 == 0) {
            if ((cctx->seqCollector).collectSequences != 1) {
              __assert_fail("cSize > 0 || cctx->seqCollector.collectSequences == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x620e,
                            "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                           );
            }
            uVar14 = 0;
          }
        }
        else {
          if (ZVar6 == ZSTD_ps_auto) {
            __assert_fail("cctxParams->useBlockSplitter != ZSTD_ps_auto",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x5b33,"int ZSTD_blockSplitterEnabled(ZSTD_CCtx_params *)");
          }
          sVar13 = ZSTD_compressBlock_internal
                             (cctx,(void *)((long)dst_00 + 3),dstCapacity - 3,local_110,sVar17,1);
          if (0xffffffffffffff88 < sVar13) {
            return sVar13;
          }
          uVar15 = 2;
          uVar23 = sVar17;
          if (sVar13 != 1) {
            if (sVar13 == 0) {
              uVar14 = sVar17 + 3;
              if (dstCapacity < uVar14) {
                return 0xffffffffffffffba;
              }
              *dst_00 = uVar9 + sVar10 * 8;
              *(char *)(dst_00 + 1) = (char)(sVar17 >> 0xd);
              memcpy((void *)((long)dst_00 + 3),local_110,sVar17);
              if (0xffffffffffffff88 < uVar14) {
                return uVar14;
              }
              goto LAB_0015eeb6;
            }
            uVar15 = 4;
            uVar23 = sVar13;
          }
          *dst_00 = (uVar15 | uVar9) + (short)uVar23 * 8;
          *(char *)(dst_00 + 1) = (char)(uVar23 >> 0xd);
          uVar14 = sVar13 + 3;
        }
      }
      else {
        sVar13 = ZSTD_buildSeqStore(cctx,local_110,sVar17);
        if (0xffffffffffffff88 < sVar13) {
          return sVar13;
        }
        if (sVar13 == 0) {
          if (((cctx->isFirstBlock != 0) || (iVar12 = ZSTD_maybeRLE(origSeqStore), iVar12 == 0)) ||
             (iVar12 = ZSTD_isRLE(local_110,sVar17), iVar12 == 0)) {
            uVar14 = ZSTD_compressSuperBlock(cctx,dst_00,dstCapacity,local_110,sVar17,uVar5);
            if (uVar14 != 0xffffffffffffffba) {
              sVar13 = ZSTD_minGain(sVar17,(cctx->appliedParams).cParams.strategy);
              if (0xffffffffffffff88 < uVar14) {
                return uVar14;
              }
              if ((uVar14 != 0) && (uVar14 < (sVar17 - sVar13) + 3)) {
                uVar2 = (cctx->blockState).prevCBlock;
                uVar3 = (cctx->blockState).nextCBlock;
                auVar30._8_4_ = (int)uVar2;
                auVar30._0_8_ = uVar3;
                auVar30._12_4_ = (int)((ulong)uVar2 >> 0x20);
                (cctx->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
                (cctx->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar30._8_8_;
                goto LAB_0015ee86;
              }
            }
            goto LAB_0015ee49;
          }
          BVar4 = *local_110;
          *dst_00 = uVar9 + sVar10 * 8 + 2;
          *(char *)(dst_00 + 1) = (char)(sVar17 >> 0xd);
          *(BYTE *)((long)dst_00 + 3) = BVar4;
          uVar14 = 4;
        }
        else {
LAB_0015ee49:
          uVar14 = sVar17 + 3;
          if (dstCapacity < uVar14) {
            return 0xffffffffffffffba;
          }
          *dst_00 = uVar9 + sVar10 * 8;
          *(char *)(dst_00 + 1) = (char)(sVar17 >> 0xd);
          memcpy((void *)((long)dst_00 + 3),local_110,sVar17);
          if (0xffffffffffffff88 < uVar14) {
            return uVar14;
          }
        }
LAB_0015ee86:
        pZVar7 = (cctx->blockState).prevCBlock;
        if ((pZVar7->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
          (pZVar7->entropy).fse.offcode_repeatMode = FSE_repeat_check;
        }
        if (uVar14 == 0) {
          __assert_fail("cSize > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x6209,
                        "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                       );
        }
        if (sVar17 + 3 < uVar14) {
          __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x620a,
                        "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                       );
        }
      }
LAB_0015eeb6:
      bVar28 = dstCapacity < uVar14;
      dstCapacity = dstCapacity - uVar14;
      if (bVar28) {
        __assert_fail("dstCapacity >= cSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6226,
                      "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                     );
      }
      dst_00 = (short *)((long)dst_00 + uVar14);
      cctx->isFirstBlock = 0;
      local_110 = local_38;
    }
    if ((lastFrameChunk != 0) && (dst < dst_00)) {
      cctx->stage = ZSTDcs_ending;
    }
    uVar23 = (long)dst_00 - (long)dst;
  }
  if (uVar23 < 0xffffffffffffff89) {
    uVar20 = srcSize + cctx->consumedSrcSize;
    cctx->consumedSrcSize = uVar20;
    uVar23 = uVar23 + local_58;
    cctx->producedCSize = cctx->producedCSize + uVar23;
    uVar14 = cctx->pledgedSrcSizePlusOne;
    if (uVar14 == 0 && (cctx->appliedParams).fParams.contentSizeFlag != 0) {
      __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x62c4,
                    "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                   );
    }
    sVar17 = 0xffffffffffffffb8;
    if (uVar20 + 1 <= uVar14) {
      sVar17 = uVar23;
    }
    if (uVar14 != 0) {
      uVar23 = sVar17;
    }
  }
  return uVar23;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}